

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O3

bool __thiscall
Fossilize::find_extension
          (Fossilize *this,
          vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *exts,char *ext)

{
  int iVar1;
  long lVar2;
  long lVar3;
  Fossilize *pFVar4;
  Fossilize *pFVar5;
  
  lVar2 = (long)exts - (long)this;
  lVar3 = (lVar2 >> 2) * 0xfc0fc0fc0fc0fc1 >> 2;
  if (0 < lVar3) {
    pFVar5 = this + lVar3 * 0x410;
    lVar3 = lVar3 + 1;
    do {
      iVar1 = strcmp(ext,(char *)this);
      pFVar4 = this;
      if (iVar1 == 0) goto LAB_0018727a;
      iVar1 = strcmp(ext,(char *)(this + 0x104));
      pFVar4 = this + 0x104;
      if (iVar1 == 0) goto LAB_0018727a;
      iVar1 = strcmp(ext,(char *)(this + 0x208));
      pFVar4 = this + 0x208;
      if (iVar1 == 0) goto LAB_0018727a;
      iVar1 = strcmp(ext,(char *)(this + 0x30c));
      pFVar4 = this + 0x30c;
      if (iVar1 == 0) goto LAB_0018727a;
      this = this + 0x410;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
    lVar2 = (long)exts - (long)pFVar5;
    this = pFVar5;
  }
  lVar2 = (lVar2 >> 2) * 0xfc0fc0fc0fc0fc1;
  if (lVar2 != 1) {
    if (lVar2 != 2) {
      pFVar4 = (Fossilize *)exts;
      if ((lVar2 != 3) || (iVar1 = strcmp(ext,(char *)this), pFVar4 = this, iVar1 == 0))
      goto LAB_0018727a;
      this = this + 0x104;
    }
    iVar1 = strcmp(ext,(char *)this);
    pFVar4 = this;
    if (iVar1 == 0) goto LAB_0018727a;
    this = this + 0x104;
  }
  iVar1 = strcmp(ext,(char *)this);
  pFVar4 = this;
  if (iVar1 != 0) {
    pFVar4 = (Fossilize *)exts;
  }
LAB_0018727a:
  return pFVar4 != (Fossilize *)exts;
}

Assistant:

static bool find_extension(const vector<VkExtensionProperties> &exts, const char *ext)
{
	auto itr = find_if(begin(exts), end(exts), [&](const VkExtensionProperties &prop) -> bool {
		return strcmp(ext, prop.extensionName) == 0;
	});
	return itr != end(exts);
}